

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSet.cpp
# Opt level: O2

void __thiscall Js::JavascriptSet::Clear(JavascriptSet *this)

{
  bool bVar1;
  ThreadContext *pTVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  
  pTVar2 = ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr
             )->super_JavascriptLibraryBase).scriptContext.ptr)->threadContext;
  bVar1 = pTVar2->noJsReentrancy;
  pTVar2->noJsReentrancy = true;
  (this->list).first.ptr = (MapOrSetDataNode<void_*> *)0x0;
  (this->list).last.ptr = (MapOrSetDataNode<void_*> *)0x0;
  switch(this->kind) {
  case EmptySet:
    break;
  case IntSet:
    BVSparse<Memory::Recycler>::ClearAll((BVSparse<Memory::Recycler> *)this->u);
    break;
  case SimpleVarSet:
    JsUtil::
    BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Clear((BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             *)this->u);
    break;
  case ComplexVarSet:
    JsUtil::
    BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Clear((BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             *)this->u);
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSet.cpp"
                                ,0x1da,"((0))","(0)");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  pTVar2->noJsReentrancy = bVar1;
  return;
}

Assistant:

void JavascriptSet::Clear()
{
    JS_REENTRANCY_LOCK(jsReentLock, this->GetScriptContext()->GetThreadContext());
    this->list.Clear();
    switch (this->kind)
    {
    case SetKind::EmptySet:
        return;
    case SetKind::IntSet:
        this->u.intSet->ClearAll();
        return;
    case SetKind::SimpleVarSet:
        this->u.simpleVarSet->Clear();
        return;
    case SetKind::ComplexVarSet:
        this->u.complexVarSet->Clear();
        return;
    default:
        Assume(UNREACHED);
    }
}